

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blocksort.c
# Opt level: O0

void mainSort(UInt32 *ptr,UChar *block,UInt16 *quadrant,UInt32 *ftab,Int32 nblock,Int32 verb,
             Int32 *budget)

{
  UChar UVar1;
  UChar UVar2;
  UInt32 UVar3;
  byte bVar4;
  ushort uVar5;
  UInt16 UVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  int hiSt;
  UInt16 qVal;
  Int32 a2update;
  Int32 shifts;
  Int32 bbSize;
  Int32 bbStart;
  Int32 hi;
  Int32 lo;
  Int32 h;
  Int32 vv;
  UInt16 s;
  Int32 numQSorted;
  UChar c1;
  Int32 copyEnd [256];
  Int32 copyStart [256];
  Bool_conflict bigDone [256];
  Int32 runningOrder [256];
  Int32 sb;
  Int32 ss;
  Int32 k;
  Int32 j;
  Int32 i;
  Int32 verb_local;
  Int32 nblock_local;
  UInt32 *ftab_local;
  UInt16 *quadrant_local;
  UChar *block_local;
  UInt32 *ptr_local;
  
  if (3 < verb) {
    fprintf(_stderr,"        main sort initialise ...\n");
  }
  for (k = 0x10000; -1 < k; k = k + -1) {
    ftab[k] = 0;
  }
  ss = (uint)*block << 8;
  for (k = nblock + -1; 2 < k; k = k + -4) {
    quadrant[k] = 0;
    uVar7 = ss >> 8 | (uint)block[k] << 8;
    ftab[(int)uVar7] = ftab[(int)uVar7] + 1;
    quadrant[k + -1] = 0;
    uVar7 = (int)uVar7 >> 8 | (uint)block[k + -1] << 8;
    ftab[(int)uVar7] = ftab[(int)uVar7] + 1;
    quadrant[k + -2] = 0;
    uVar7 = (int)uVar7 >> 8 | (uint)block[k + -2] << 8;
    ftab[(int)uVar7] = ftab[(int)uVar7] + 1;
    quadrant[k + -3] = 0;
    ss = (int)uVar7 >> 8 | (uint)block[k + -3] << 8;
    ftab[ss] = ftab[ss] + 1;
  }
  for (; -1 < k; k = k + -1) {
    quadrant[k] = 0;
    ss = ss >> 8 | (uint)block[k] << 8;
    ftab[ss] = ftab[ss] + 1;
  }
  for (k = 0; k < 0x22; k = k + 1) {
    block[nblock + k] = block[k];
    quadrant[nblock + k] = 0;
  }
  if (3 < verb) {
    fprintf(_stderr,"        bucket sorting ...\n");
  }
  for (k = 1; k < 0x10001; k = k + 1) {
    ftab[k] = ftab[k + -1] + ftab[k];
  }
  h._2_2_ = (ushort)*block << 8;
  for (k = nblock + -1; 2 < k; k = k + -4) {
    bVar4 = block[k];
    uVar5 = h._2_2_ >> 8 | (ushort)bVar4 << 8;
    UVar3 = ftab[uVar5];
    ftab[uVar5] = UVar3 - 1;
    ptr[(int)(UVar3 - 1)] = k;
    UVar1 = block[k + -1];
    uVar5 = CONCAT11(UVar1,bVar4);
    UVar3 = ftab[uVar5];
    ftab[uVar5] = UVar3 - 1;
    ptr[(int)(UVar3 - 1)] = k - 1;
    UVar2 = block[k + -2];
    uVar5 = CONCAT11(UVar2,UVar1);
    UVar3 = ftab[uVar5];
    ftab[uVar5] = UVar3 - 1;
    ptr[(int)(UVar3 - 1)] = k - 2;
    h._2_2_ = CONCAT11(block[k + -3],UVar2);
    UVar3 = ftab[h._2_2_];
    ftab[h._2_2_] = UVar3 - 1;
    ptr[(int)(UVar3 - 1)] = k - 3;
  }
  for (; -1 < k; k = k + -1) {
    h._2_2_ = h._2_2_ >> 8 | (ushort)block[k] << 8;
    UVar3 = ftab[h._2_2_];
    ftab[h._2_2_] = UVar3 - 1;
    ptr[(int)(UVar3 - 1)] = k;
  }
  for (k = 0; k < 0x100; k = k + 1) {
    *(undefined1 *)((long)copyStart + (long)k + 0x3f8) = 0;
    runningOrder[(long)k + -2] = k;
  }
  hi = 1;
  do {
    hi = hi * 3 + 1;
  } while (hi < 0x101);
  do {
    hi = hi / 3;
    for (k = hi; k < 0x100; k = k + 1) {
      iVar8 = runningOrder[(long)k + -2];
      ss = k;
      do {
        if (ftab[(runningOrder[(long)(ss - hi) + -2] + 1) * 0x100] -
            ftab[runningOrder[(long)(ss - hi) + -2] << 8] <=
            ftab[(iVar8 + 1) * 0x100] - ftab[iVar8 << 8]) break;
        runningOrder[(long)ss + -2] = runningOrder[(long)(ss - hi) + -2];
        ss = ss - hi;
      } while (hi + -1 < ss);
      runningOrder[(long)ss + -2] = iVar8;
    }
    if (hi == 1) {
      vv = 0;
      k = 0;
      do {
        if (0xff < k) {
          if (3 < verb) {
            fprintf(_stderr,"        %d pointers, %d sorted, %d scanned\n",(ulong)(uint)nblock,
                    (ulong)(uint)vv,(ulong)(uint)(nblock - vv));
          }
          return;
        }
        uVar7 = runningOrder[(long)k + -2];
        for (ss = 0; ss < 0x100; ss = ss + 1) {
          if (ss != uVar7) {
            iVar8 = uVar7 * 0x100 + ss;
            if ((ftab[iVar8] & 0x200000) == 0) {
              uVar9 = ftab[iVar8] & 0xffdfffff;
              hiSt = (ftab[iVar8 + 1] & 0xffdfffff) - 1;
              if ((int)uVar9 < hiSt) {
                if (3 < verb) {
                  fprintf(_stderr,"        qsort [0x%x, 0x%x]   done %d   this %d\n",(ulong)uVar7,
                          (ulong)(uint)ss,(ulong)(uint)vv,(ulong)((hiSt - uVar9) + 1));
                }
                mainQSort3(ptr,block,quadrant,nblock,uVar9,hiSt,2,budget);
                vv = (hiSt - uVar9) + 1 + vv;
                if (*budget < 0) {
                  return;
                }
              }
            }
            ftab[iVar8] = ftab[iVar8] | 0x200000;
          }
        }
        if (*(char *)((long)copyStart + (long)(int)uVar7 + 0x3f8) != '\0') {
          BZ2_bz__AssertH__fail(0x3ee);
        }
        for (ss = 0; ss < 0x100; ss = ss + 1) {
          copyEnd[(long)ss + 0xfe] = ftab[(int)(ss * 0x100 + uVar7)] & 0xffdfffff;
          (&numQSorted)[ss] = (ftab[(int)(ss * 0x100 + uVar7 + 1)] & 0xffdfffff) - 1;
        }
        for (ss = ftab[(int)(uVar7 << 8)] & 0xffdfffff; ss < copyEnd[(long)(int)uVar7 + 0xfe];
            ss = ss + 1) {
          sb = ptr[ss] - 1;
          if (sb < 0) {
            sb = nblock + sb;
          }
          bVar4 = block[sb];
          if (*(char *)((long)copyStart + (ulong)bVar4 + 0x3f8) == '\0') {
            iVar8 = copyEnd[(ulong)bVar4 + 0xfe];
            copyEnd[(ulong)bVar4 + 0xfe] = iVar8 + 1;
            ptr[iVar8] = sb;
          }
        }
        ss = ftab[(int)((uVar7 + 1) * 0x100)] & 0xffdfffff;
        while (ss = ss - 1, (&numQSorted)[(int)uVar7] < ss) {
          sb = ptr[ss] - 1;
          if (sb < 0) {
            sb = nblock + sb;
          }
          bVar4 = block[sb];
          if (*(char *)((long)copyStart + (ulong)bVar4 + 0x3f8) == '\0') {
            iVar8 = (&numQSorted)[bVar4];
            (&numQSorted)[bVar4] = iVar8 + -1;
            ptr[iVar8] = sb;
          }
        }
        if ((copyEnd[(long)(int)uVar7 + 0xfe] + -1 != (&numQSorted)[(int)uVar7]) &&
           ((copyEnd[(long)(int)uVar7 + 0xfe] != 0 || ((&numQSorted)[(int)uVar7] != nblock + -1))))
        {
          BZ2_bz__AssertH__fail(0x3ef);
        }
        for (ss = 0; ss < 0x100; ss = ss + 1) {
          iVar8 = ss * 0x100 + uVar7;
          ftab[iVar8] = ftab[iVar8] | 0x200000;
        }
        *(undefined1 *)((long)copyStart + (long)(int)uVar7 + 0x3f8) = 1;
        if (k < 0xff) {
          uVar9 = ftab[(int)(uVar7 << 8)];
          iVar8 = (ftab[(int)((uVar7 + 1) * 0x100)] & 0xffdfffff) - (uVar9 & 0xffdfffff);
          for (bVar4 = 0; ss = iVar8, 0xfffe < iVar8 >> (bVar4 & 0x1f); bVar4 = bVar4 + 1) {
          }
          while (ss = ss + -1, -1 < ss) {
            UVar3 = ptr[(int)((uVar9 & 0xffdfffff) + ss)];
            UVar6 = (UInt16)(ss >> (bVar4 & 0x1f));
            quadrant[(int)UVar3] = UVar6;
            if ((int)UVar3 < 0x22) {
              quadrant[(int)(UVar3 + nblock)] = UVar6;
            }
          }
          if (0xffff < iVar8 + -1 >> (bVar4 & 0x1f)) {
            BZ2_bz__AssertH__fail(0x3ea);
          }
        }
        k = k + 1;
      } while( true );
    }
  } while( true );
}

Assistant:

static
void mainSort ( UInt32* ptr, 
                UChar*  block,
                UInt16* quadrant, 
                UInt32* ftab,
                Int32   nblock,
                Int32   verb,
                Int32*  budget )
{
   Int32  i, j, k, ss, sb;
   Int32  runningOrder[256];
   Bool   bigDone[256];
   Int32  copyStart[256];
   Int32  copyEnd  [256];
   UChar  c1;
   Int32  numQSorted;
   UInt16 s;
   if (verb >= 4) VPrintf0 ( "        main sort initialise ...\n" );

   /*-- set up the 2-byte frequency table --*/
   for (i = 65536; i >= 0; i--) ftab[i] = 0;

   j = block[0] << 8;
   i = nblock-1;
   for (; i >= 3; i -= 4) {
      quadrant[i] = 0;
      j = (j >> 8) | ( ((UInt16)block[i]) << 8);
      ftab[j]++;
      quadrant[i-1] = 0;
      j = (j >> 8) | ( ((UInt16)block[i-1]) << 8);
      ftab[j]++;
      quadrant[i-2] = 0;
      j = (j >> 8) | ( ((UInt16)block[i-2]) << 8);
      ftab[j]++;
      quadrant[i-3] = 0;
      j = (j >> 8) | ( ((UInt16)block[i-3]) << 8);
      ftab[j]++;
   }
   for (; i >= 0; i--) {
      quadrant[i] = 0;
      j = (j >> 8) | ( ((UInt16)block[i]) << 8);
      ftab[j]++;
   }

   /*-- (emphasises close relationship of block & quadrant) --*/
   for (i = 0; i < BZ_N_OVERSHOOT; i++) {
      block   [nblock+i] = block[i];
      quadrant[nblock+i] = 0;
   }

   if (verb >= 4) VPrintf0 ( "        bucket sorting ...\n" );

   /*-- Complete the initial radix sort --*/
   for (i = 1; i <= 65536; i++) ftab[i] += ftab[i-1];

   s = block[0] << 8;
   i = nblock-1;
   for (; i >= 3; i -= 4) {
      s = (s >> 8) | (block[i] << 8);
      j = ftab[s] -1;
      ftab[s] = j;
      ptr[j] = i;
      s = (s >> 8) | (block[i-1] << 8);
      j = ftab[s] -1;
      ftab[s] = j;
      ptr[j] = i-1;
      s = (s >> 8) | (block[i-2] << 8);
      j = ftab[s] -1;
      ftab[s] = j;
      ptr[j] = i-2;
      s = (s >> 8) | (block[i-3] << 8);
      j = ftab[s] -1;
      ftab[s] = j;
      ptr[j] = i-3;
   }
   for (; i >= 0; i--) {
      s = (s >> 8) | (block[i] << 8);
      j = ftab[s] -1;
      ftab[s] = j;
      ptr[j] = i;
   }

   /*--
      Now ftab contains the first loc of every small bucket.
      Calculate the running order, from smallest to largest
      big bucket.
   --*/
   for (i = 0; i <= 255; i++) {
      bigDone     [i] = False;
      runningOrder[i] = i;
   }

   {
      Int32 vv;
      Int32 h = 1;
      do h = 3 * h + 1; while (h <= 256);
      do {
         h = h / 3;
         for (i = h; i <= 255; i++) {
            vv = runningOrder[i];
            j = i;
            while ( BIGFREQ(runningOrder[j-h]) > BIGFREQ(vv) ) {
               runningOrder[j] = runningOrder[j-h];
               j = j - h;
               if (j <= (h - 1)) goto zero;
            }
            zero:
            runningOrder[j] = vv;
         }
      } while (h != 1);
   }

   /*--
      The main sorting loop.
   --*/

   numQSorted = 0;

   for (i = 0; i <= 255; i++) {

      /*--
         Process big buckets, starting with the least full.
         Basically this is a 3-step process in which we call
         mainQSort3 to sort the small buckets [ss, j], but
         also make a big effort to avoid the calls if we can.
      --*/
      ss = runningOrder[i];

      /*--
         Step 1:
         Complete the big bucket [ss] by quicksorting
         any unsorted small buckets [ss, j], for j != ss.  
         Hopefully previous pointer-scanning phases have already
         completed many of the small buckets [ss, j], so
         we don't have to sort them at all.
      --*/
      for (j = 0; j <= 255; j++) {
         if (j != ss) {
            sb = (ss << 8) + j;
            if ( ! (ftab[sb] & SETMASK) ) {
               Int32 lo = ftab[sb]   & CLEARMASK;
               Int32 hi = (ftab[sb+1] & CLEARMASK) - 1;
               if (hi > lo) {
                  if (verb >= 4)
                     VPrintf4 ( "        qsort [0x%x, 0x%x]   "
                                "done %d   this %d\n",
                                ss, j, numQSorted, hi - lo + 1 );
                  mainQSort3 ( 
                     ptr, block, quadrant, nblock, 
                     lo, hi, BZ_N_RADIX, budget 
                  );   
                  numQSorted += (hi - lo + 1);
                  if (*budget < 0) return;
               }
            }
            ftab[sb] |= SETMASK;
         }
      }

      AssertH ( !bigDone[ss], 1006 );

      /*--
         Step 2:
         Now scan this big bucket [ss] so as to synthesise the
         sorted order for small buckets [t, ss] for all t,
         including, magically, the bucket [ss,ss] too.
         This will avoid doing Real Work in subsequent Step 1's.
      --*/
      {
         for (j = 0; j <= 255; j++) {
            copyStart[j] =  ftab[(j << 8) + ss]     & CLEARMASK;
            copyEnd  [j] = (ftab[(j << 8) + ss + 1] & CLEARMASK) - 1;
         }
         for (j = ftab[ss << 8] & CLEARMASK; j < copyStart[ss]; j++) {
            k = ptr[j]-1; if (k < 0) k += nblock;
            c1 = block[k];
            if (!bigDone[c1])
               ptr[ copyStart[c1]++ ] = k;
         }
         for (j = (ftab[(ss+1) << 8] & CLEARMASK) - 1; j > copyEnd[ss]; j--) {
            k = ptr[j]-1; if (k < 0) k += nblock;
            c1 = block[k];
            if (!bigDone[c1]) 
               ptr[ copyEnd[c1]-- ] = k;
         }
      }

      AssertH ( (copyStart[ss]-1 == copyEnd[ss])
                || 
                /* Extremely rare case missing in bzip2-1.0.0 and 1.0.1.
                   Necessity for this case is demonstrated by compressing 
                   a sequence of approximately 48.5 million of character 
                   251; 1.0.0/1.0.1 will then die here. */
                (copyStart[ss] == 0 && copyEnd[ss] == nblock-1),
                1007 )

      for (j = 0; j <= 255; j++) ftab[(j << 8) + ss] |= SETMASK;

      /*--
         Step 3:
         The [ss] big bucket is now done.  Record this fact,
         and update the quadrant descriptors.  Remember to
         update quadrants in the overshoot area too, if
         necessary.  The "if (i < 255)" test merely skips
         this updating for the last bucket processed, since
         updating for the last bucket is pointless.

         The quadrant array provides a way to incrementally
         cache sort orderings, as they appear, so as to 
         make subsequent comparisons in fullGtU() complete
         faster.  For repetitive blocks this makes a big
         difference (but not big enough to be able to avoid
         the fallback sorting mechanism, exponential radix sort).

         The precise meaning is: at all times:

            for 0 <= i < nblock and 0 <= j <= nblock

            if block[i] != block[j], 

               then the relative values of quadrant[i] and 
                    quadrant[j] are meaningless.

               else {
                  if quadrant[i] < quadrant[j]
                     then the string starting at i lexicographically
                     precedes the string starting at j

                  else if quadrant[i] > quadrant[j]
                     then the string starting at j lexicographically
                     precedes the string starting at i

                  else
                     the relative ordering of the strings starting
                     at i and j has not yet been determined.
               }
      --*/
      bigDone[ss] = True;

      if (i < 255) {
         Int32 bbStart  = ftab[ss << 8] & CLEARMASK;
         Int32 bbSize   = (ftab[(ss+1) << 8] & CLEARMASK) - bbStart;
         Int32 shifts   = 0;

         while ((bbSize >> shifts) > 65534) shifts++;

         for (j = bbSize-1; j >= 0; j--) {
            Int32 a2update     = ptr[bbStart + j];
            UInt16 qVal        = (UInt16)(j >> shifts);
            quadrant[a2update] = qVal;
            if (a2update < BZ_N_OVERSHOOT)
               quadrant[a2update + nblock] = qVal;
         }
         AssertH ( ((bbSize-1) >> shifts) <= 65535, 1002 );
      }

   }

   if (verb >= 4)
      VPrintf3 ( "        %d pointers, %d sorted, %d scanned\n",
                 nblock, numQSorted, nblock - numQSorted );
}